

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSTL.cpp
# Opt level: O2

void __thiscall
adios2::format::BufferSTL::Reset(BufferSTL *this,bool resetAbsolutePosition,bool zeroInitialize)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  ulong uVar4;
  
  (this->super_Buffer).m_Position = 0;
  if ((int)CONCAT71(in_register_00000031,resetAbsolutePosition) != 0) {
    (this->super_Buffer).m_AbsolutePosition = 0;
  }
  if (zeroInitialize) {
    pcVar1 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar2 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
      *pcVar2 = '\0';
    }
  }
  else {
    pcVar2 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar2;
    uVar3 = 0x400;
    if (uVar4 < 0x400) {
      uVar3 = uVar4;
    }
    std::
    __fill_n_a<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,unsigned_long,int>
              (pcVar2,uVar3);
    if (0x400 < uVar4) {
      uVar3 = 0x400;
      if (0x400 < uVar4 - 0x400) {
        uVar3 = uVar4 - 0x400;
      }
      std::
      __fill_n_a<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,unsigned_long,int>
                ((this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3,uVar4 - uVar3);
    }
  }
  return;
}

Assistant:

void BufferSTL::Reset(const bool resetAbsolutePosition, const bool zeroInitialize)
{
    m_Position = 0;
    if (resetAbsolutePosition)
    {
        m_AbsolutePosition = 0;
    }
    if (zeroInitialize)
    {
        std::fill(m_Buffer.begin(), m_Buffer.end(), 0);
    }
    else
    {
        // just zero out the first and last 1kb
        const size_t bufsize = m_Buffer.size();
        size_t s = (bufsize < 1024 ? bufsize : 1024);
        std::fill_n(m_Buffer.begin(), s, 0);
        if (bufsize > 1024)
        {
            size_t pos = bufsize - 1024;
            if (pos < 1024)
            {
                pos = 1024;
            }
            s = bufsize - pos;
            std::fill_n(next(m_Buffer.begin(), pos), s, 0);
        }
    }
}